

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

GenericSoundEssenceDescriptor * __thiscall
ASDCP::MXF::GenericSoundEssenceDescriptor::InitFromTLVSet
          (GenericSoundEssenceDescriptor *this,TLVReader *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    FileDescriptor::InitFromTLVSet(&this->super_FileDescriptor,TLVSet);
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_AudioSamplingRate);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_Locked);
      TLVReader::ReadUi8(&local_80,in_RDX,pMVar1->ul);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_AudioRefLevel);
      TLVReader::ReadUi8(&local_80,in_RDX,pMVar1->ul);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)((long)&TLVSet[4].m_Lookup + 2) =
           *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                    super_KLVPacket._vptr_KLVPacket == Kumu::RESULT_OK;
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_ElectroSpatialFormulation);
      TLVReader::ReadUi8(&local_80,in_RDX,pMVar1->ul);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)((long)&TLVSet[4].m_Lookup + 4) =
           *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                    super_KLVPacket._vptr_KLVPacket == Kumu::RESULT_OK;
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_ChannelCount);
      TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_QuantizationBits);
      TLVReader::ReadUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_DialNorm);
      TLVReader::ReadUi8(&local_80,in_RDX,pMVar1->ul);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)((long)&TLVSet[5].super_MemIOReader.m_capacity + 1) =
           *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                    super_KLVPacket._vptr_KLVPacket == Kumu::RESULT_OK;
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_SoundEssenceCoding);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_ReferenceAudioAlignmentLevel);
      TLVReader::ReadUi8(&local_80,in_RDX,pMVar1->ul);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)((long)&TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right
               + 1) =
           *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                    super_KLVPacket._vptr_KLVPacket == Kumu::RESULT_OK;
    }
    if (-1 < *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                      super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericSoundEssenceDescriptor_ReferenceImageEditRate);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      *(bool *)&TLVSet[6].super_MemIOReader.m_p =
           *(int *)&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                    super_KLVPacket._vptr_KLVPacket == Kumu::RESULT_OK;
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x5d9,
                "virtual ASDCP::Result_t ASDCP::MXF::GenericSoundEssenceDescriptor::InitFromTLVSet(TLVReader &)"
               );
}

Assistant:

ASDCP::Result_t
GenericSoundEssenceDescriptor::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = FileDescriptor::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericSoundEssenceDescriptor, AudioSamplingRate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi8(OBJ_READ_ARGS(GenericSoundEssenceDescriptor, Locked));
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(GenericSoundEssenceDescriptor, AudioRefLevel));
    AudioRefLevel.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(GenericSoundEssenceDescriptor, ElectroSpatialFormulation));
    ElectroSpatialFormulation.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(GenericSoundEssenceDescriptor, ChannelCount));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadUi32(OBJ_READ_ARGS(GenericSoundEssenceDescriptor, QuantizationBits));
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(GenericSoundEssenceDescriptor, DialNorm));
    DialNorm.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericSoundEssenceDescriptor, SoundEssenceCoding));
  if ( ASDCP_SUCCESS(result) ) { 
    result = TLVSet.ReadUi8(OBJ_READ_ARGS_OPT(GenericSoundEssenceDescriptor, ReferenceAudioAlignmentLevel));
    ReferenceAudioAlignmentLevel.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(GenericSoundEssenceDescriptor, ReferenceImageEditRate));
    ReferenceImageEditRate.set_has_value( result == RESULT_OK );
  }
  return result;
}